

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall HighsCliqueTable::removeClique(HighsCliqueTable *this,HighsInt cliqueid)

{
  uint uVar1;
  CliqueVar CVar2;
  CliqueVar CVar3;
  pointer pCVar4;
  iterator iVar5;
  pointer pCVar6;
  uint uVar7;
  KeyType KVar8;
  HighsInt start;
  HighsInt len;
  HighsInt local_2c;
  uint local_28;
  int local_24;
  KeyType local_20;
  
  pCVar4 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar1 = pCVar4[cliqueid].origin;
  local_2c = cliqueid;
  if ((uVar1 | 0x80000000) != 0xffffffff) {
    iVar5._M_current =
         (this->deletedrows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->deletedrows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->deletedrows,iVar5,
                 &pCVar4[cliqueid].origin);
    }
    else {
      *iVar5._M_current = uVar1;
      (this->deletedrows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    }
  }
  pCVar4 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_28 = pCVar4[local_2c].start;
  uVar1 = pCVar4[local_2c].end;
  local_24 = uVar1 - local_28;
  uVar7 = local_28;
  if (local_24 == 2) {
    pCVar6 = (this->cliqueentries).
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ._M_impl.super__Vector_impl_data._M_start;
    CVar2 = pCVar6[(int)local_28];
    CVar3 = pCVar6[(long)(int)local_28 + 1];
    KVar8.second = CVar2;
    KVar8.first = CVar3;
    local_20 = (KeyType)((long)KVar8 << 0x20 | (ulong)(uint)CVar2);
    if (((uint)CVar3 & 0x7fffffff) < ((uint)CVar2 & 0x7fffffff)) {
      local_20 = KVar8;
    }
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::erase
              (&this->sizeTwoCliques,&local_20);
    uVar7 = local_28;
  }
  for (; uVar7 != uVar1; uVar7 = uVar7 + 1) {
    unlink(this,(char *)(ulong)uVar7);
  }
  iVar5._M_current =
       (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->freeslots,iVar5,&local_2c);
  }
  else {
    *iVar5._M_current = local_2c;
    (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current + 1;
  }
  std::
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  ::_M_emplace_unique<int&,int&>
            ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              *)&this->freespaces,&local_24,(int *)&local_28);
  pCVar4 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar4[local_2c].start = -1;
  pCVar4[local_2c].end = -1;
  this->numEntries = this->numEntries - local_24;
  return;
}

Assistant:

void HighsCliqueTable::removeClique(HighsInt cliqueid) {
  if (cliques[cliqueid].origin != kHighsIInf && cliques[cliqueid].origin != -1)
    deletedrows.push_back(cliques[cliqueid].origin);

  HighsInt start = cliques[cliqueid].start;
  assert(start != -1);
  HighsInt end = cliques[cliqueid].end;
  HighsInt len = end - start;
  if (len == 2) {
    sizeTwoCliques.erase(
        sortedEdge(cliqueentries[start], cliqueentries[start + 1]));
  }

  for (HighsInt i = start; i != end; ++i) {
    unlink(i, cliqueid);
  }

  freeslots.push_back(cliqueid);
  freespaces.emplace(len, start);

  cliques[cliqueid].start = -1;
  cliques[cliqueid].end = -1;
  numEntries -= len;
}